

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O0

uint Abc_NtkDontCareCofactors_rec(Odc_Man_t *p,Odc_Lit_t Lit,uint uMask)

{
  Odc_Lit_t OVar1;
  Odc_Lit_t OVar2;
  Odc_Lit_t iFan1;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Odc_Obj_t *pObj_00;
  Odc_Lit_t uRes1;
  Odc_Lit_t uRes0;
  Odc_Lit_t uLit1;
  Odc_Lit_t uLit0;
  uint uData1;
  uint uData0;
  Odc_Obj_t *pObj;
  uint uMask_local;
  Odc_Lit_t Lit_local;
  Odc_Man_t *p_local;
  
  iVar3 = Odc_IsComplement(Lit);
  if (iVar3 != 0) {
    __assert_fail("!Odc_IsComplement(Lit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcOdc.c"
                  ,0x2e7,
                  "unsigned int Abc_NtkDontCareCofactors_rec(Odc_Man_t *, Odc_Lit_t, unsigned int)")
    ;
  }
  pObj_00 = Odc_Lit2Obj(p,Lit);
  iVar3 = Odc_ObjIsTravIdCurrent(p,pObj_00);
  if (iVar3 == 0) {
    Odc_ObjSetTravIdCurrent(p,pObj_00);
    if ((pObj_00->uMask & uMask) == 0) {
      p_local._4_4_ = CONCAT22(Lit,Lit);
      pObj_00->uData = p_local._4_4_;
    }
    else {
      if ((pObj_00->uMask == uMask) && (iVar3 = Odc_IsTerm(p,Lit), iVar3 != 0)) {
        OVar1 = Odc_Const1();
        OVar2 = Odc_Const0();
        pObj_00->uData = CONCAT22(OVar1,OVar2);
        return CONCAT22(OVar1,OVar2);
      }
      OVar1 = Odc_ObjFanin0(pObj_00);
      uVar4 = Abc_NtkDontCareCofactors_rec(p,OVar1,uMask);
      OVar1 = Odc_ObjFanin1(pObj_00);
      uVar5 = Abc_NtkDontCareCofactors_rec(p,OVar1,uMask);
      iVar3 = Odc_ObjFaninC0(pObj_00);
      OVar1 = Odc_NotCond((Odc_Lit_t)uVar4,iVar3);
      iVar3 = Odc_ObjFaninC1(pObj_00);
      OVar2 = Odc_NotCond((Odc_Lit_t)uVar5,iVar3);
      OVar1 = Odc_And(p,OVar1,OVar2);
      iVar3 = Odc_ObjFaninC0(pObj_00);
      OVar2 = Odc_NotCond((Odc_Lit_t)(uVar4 >> 0x10),iVar3);
      iVar3 = Odc_ObjFaninC1(pObj_00);
      iFan1 = Odc_NotCond((Odc_Lit_t)(uVar5 >> 0x10),iVar3);
      OVar2 = Odc_And(p,OVar2,iFan1);
      p_local._4_4_ = CONCAT22(OVar2,OVar1);
      pObj_00->uData = p_local._4_4_;
    }
  }
  else {
    p_local._4_4_ = pObj_00->uData;
  }
  return p_local._4_4_;
}

Assistant:

unsigned Abc_NtkDontCareCofactors_rec( Odc_Man_t * p, Odc_Lit_t Lit, unsigned uMask )
{
    Odc_Obj_t * pObj;
    unsigned uData0, uData1;
    Odc_Lit_t uLit0, uLit1, uRes0, uRes1;
    assert( !Odc_IsComplement(Lit) );
    // skip visited objects
    pObj = Odc_Lit2Obj( p, Lit );
    if ( Odc_ObjIsTravIdCurrent(p, pObj) )
        return pObj->uData;
    Odc_ObjSetTravIdCurrent(p, pObj);
    // skip objects out of the cone
    if ( (pObj->uMask & uMask) == 0 )
        return pObj->uData = ((Lit << 16) | Lit);
    // consider the case when the node is the var
    if ( pObj->uMask == uMask && Odc_IsTerm(p, Lit) )
        return pObj->uData = ((Odc_Const1() << 16) | Odc_Const0());
    // compute the cofactors
    uData0 = Abc_NtkDontCareCofactors_rec( p, Odc_ObjFanin0(pObj), uMask );
    uData1 = Abc_NtkDontCareCofactors_rec( p, Odc_ObjFanin1(pObj), uMask );
    // find the 0-cofactor
    uLit0 = Odc_NotCond( (Odc_Lit_t)(uData0 & 0xffff), Odc_ObjFaninC0(pObj) );
    uLit1 = Odc_NotCond( (Odc_Lit_t)(uData1 & 0xffff), Odc_ObjFaninC1(pObj) );
    uRes0 = Odc_And( p, uLit0, uLit1 );
    // find the 1-cofactor
    uLit0 = Odc_NotCond( (Odc_Lit_t)(uData0 >> 16), Odc_ObjFaninC0(pObj) );
    uLit1 = Odc_NotCond( (Odc_Lit_t)(uData1 >> 16), Odc_ObjFaninC1(pObj) );
    uRes1 = Odc_And( p, uLit0, uLit1 );
    // find the result
    return pObj->uData = ((uRes1 << 16) | uRes0);
}